

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,_capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
* __thiscall
capnproto_test::capnp::test::RenamedInterface::Client::renamedMethodRequest
          (Request<capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,_capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
            (__return_storage_ptr__,(Client *)(this + *(long *)(*(long *)this + -0x18)),
             0xd112a69d31ed918b,0,&local_20,(CallHints)0x1);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,  ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
RenamedInterface::Client::renamedMethodRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,  ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>(
      0xd112a69d31ed918bull, 0, sizeHint, {true});
}